

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_negl_u16_aarch64(uint64_t x)

{
  uint64_t result;
  uint16_t tmp;
  uint64_t x_local;
  
  return CONCAT26(-(short)(x >> 0x30),
                  CONCAT24(-(short)(x >> 0x20),CONCAT22(-(short)(x >> 0x10),-(short)x)));
}

Assistant:

uint64_t HELPER(neon_negl_u16)(uint64_t x)
{
    uint16_t tmp;
    uint64_t result;
#ifdef _MSC_VER
    result = (uint16_t)(0 - x);
    tmp = 0 - (x >> 16);
    result |= (uint64_t)tmp << 16;
    tmp = 0 - (x >> 32);
    result |= (uint64_t)tmp << 32;
    tmp = 0 - (x >> 48);
#else
    result = (uint16_t)-x;
    tmp = -(x >> 16);
    result |= (uint64_t)tmp << 16;
    tmp = -(x >> 32);
    result |= (uint64_t)tmp << 32;
    tmp = -(x >> 48);
#endif
    result |= (uint64_t)tmp << 48;
    return result;
}